

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

void __thiscall QJsonValueRef::detach(QJsonValueRef *this)

{
  long lVar1;
  QJsonValueRef r;
  QCborContainerPrivate *d_00;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_RDI;
  long in_FS_OFFSET;
  QCborContainerPrivate *in_stack_00000008;
  QCborContainerPrivate *d;
  QCborContainerPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI.a[1].a.d.ptr;
  r.super_QJsonValueConstRef._8_8_ = ((in_RDI.a)->a).d.ptr;
  r.super_QJsonValueConstRef.field_0.a = in_RDI.a;
  d_00 = QJsonPrivate::Value::container(r);
  QList<QtCbor::Element>::size(&d_00->elements);
  QCborContainerPrivate::detach(d_00,0x4a1efd);
  if (((ulong)in_RDI.a[1].a.d.ptr & 1) == 0) {
    QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)this_00,in_stack_00000008);
  }
  else {
    QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)this_00,in_stack_00000008);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonValueRef::detach()
{
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
    QCborContainerPrivate *d = QJsonPrivate::Value::container(*this);
    d = QCborContainerPrivate::detach(d, d->elements.size());

    if (is_object)
        o->o.reset(d);
    else
        a->a.reset(d);
#else
    d = QCborContainerPrivate::detach(d, d->elements.size());
#endif
}